

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::BlurEffect::minimumSizeHint(BlurEffect *this)

{
  int iVar1;
  int iVar2;
  BlurEffect *this_local;
  
  if (minimumSizeHint()::size == '\0') {
    iVar1 = __cxa_guard_acquire(&minimumSizeHint()::size);
    if (iVar1 != 0) {
      iVar1 = FingerGeometry::width();
      iVar2 = FingerGeometry::height();
      QSize::QSize(&minimumSizeHint::size,iVar1 / 2,iVar2 / 2);
      __cxa_guard_release(&minimumSizeHint()::size);
    }
  }
  if (this->orientation == Horizontal) {
    this_local = (BlurEffect *)minimumSizeHint::size;
  }
  else {
    this_local = (BlurEffect *)QSize::transposed(&minimumSizeHint::size);
  }
  return (QSize)this_local;
}

Assistant:

QSize
BlurEffect::minimumSizeHint() const
{
	static const QSize size( FingerGeometry::width() / 2,
		FingerGeometry::height() / 2 );

	return ( orientation == Qt::Horizontal ? size : size.transposed() );
}